

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_sun.cpp
# Opt level: O1

void __thiscall ON_Sun::CImpl::SetNorth(CImpl *this,double north)

{
  ON_3dVector model_east;
  ON_3dVector model_north;
  ON_3dVector *pOVar1;
  double a;
  ON_Plane plane;
  ON_3dVector true_north;
  undefined1 local_120 [32];
  double dStack_100;
  double local_f8;
  double local_f0;
  double dStack_e8;
  double local_e0;
  ON_3dVector local_d8 [7];
  ON_3dVector local_28;
  
  if (this->_earth_anchor_point == (ON_EarthAnchorPoint *)0x0) {
    ::ON_XMLVariant::ON_XMLVariant((ON_XMLVariant *)local_120,north);
    ON_InternalXMLImpl::SetParameter
              (&this->super_ON_InternalXMLImpl,L"render-content-manager-document/settings/sun",
               L"north",(ON_XMLVariant *)local_120);
    ::ON_XMLVariant::~ON_XMLVariant((ON_XMLVariant *)local_120);
    goto LAB_00641fad;
  }
  ON_Plane::ON_Plane((ON_Plane *)local_120);
  GetEarthAnchorPlane(this,&local_28,(ON_Plane *)local_120);
  a = ON_RadiansFromDegrees(north + -90.0);
  ON_Plane::Rotate((ON_Plane *)local_120,a,local_d8,(ON_3dPoint *)local_120);
  pOVar1 = ON_EarthAnchorPoint::ModelEast(this->_earth_anchor_point);
  if (((1e-10 <= ABS(pOVar1->x - (double)local_120._24_8_)) ||
      (1e-10 <= ABS(pOVar1->y - dStack_100))) || (1e-10 <= ABS(pOVar1->z - local_f8))) {
LAB_00641f1d:
    model_east.y = dStack_100;
    model_east.x = (double)local_120._24_8_;
    model_east.z = local_f8;
    ON_EarthAnchorPoint::SetModelEast(this->_earth_anchor_point,model_east);
    model_north.y = dStack_e8;
    model_north.x = local_f0;
    model_north.z = local_e0;
    ON_EarthAnchorPoint::SetModelNorth(this->_earth_anchor_point,model_north);
  }
  else {
    pOVar1 = ON_EarthAnchorPoint::ModelNorth(this->_earth_anchor_point);
    if (((1e-10 <= ABS(pOVar1->x - local_f0)) || (1e-10 <= ABS(pOVar1->y - dStack_e8))) ||
       (1e-10 <= ABS(pOVar1->z - local_e0))) goto LAB_00641f1d;
  }
  ON_InternalXMLImpl::RemoveParameter
            (&this->super_ON_InternalXMLImpl,L"render-content-manager-document/settings/sun",
             L"north");
  ON_Plane::~ON_Plane((ON_Plane *)local_120);
LAB_00641fad:
  this->_calc_dirty = true;
  return;
}

Assistant:

void ON_Sun::CImpl::SetNorth(double north)
{
  if (nullptr != _earth_anchor_point)
  {
    // Store the north in the earth anchor point. This is more complicated than just setting one value.
    ON_Plane plane;
    ON_3dVector true_north;
    GetEarthAnchorPlane(true_north, plane);

    // 29 January 2013 - Kike: Don't use ON_Plane::Rotate without origin.
    // This function doesn't keep the vector length if the axis is the plane's z axis.
    plane.Rotate(ON_RadiansFromDegrees(north - 90.0), plane.zaxis, plane.origin);

    if (!IsVectorEqual(_earth_anchor_point->ModelEast(),  plane.xaxis) ||
        !IsVectorEqual(_earth_anchor_point->ModelNorth(), plane.yaxis))
    {
      _earth_anchor_point->SetModelEast (plane.xaxis);
      _earth_anchor_point->SetModelNorth(plane.yaxis);
    }

    // Make sure this value never appears in the XML. This will clean old documents that were
    // incorrectly saving this value in the XML as well as the earth anchor point.
    RemoveParameter(XMLPath_Sun(), ON_RDK_SUN_NORTH);
  }
  else
  {
    // No earth anchor point is set; store the value in the XML.
    SetParameter(XMLPath_Sun(), ON_RDK_SUN_NORTH, north);
  }

  _calc_dirty = true;
}